

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O3

unsigned_short __thiscall
libdivide::divider<unsigned_short,_(libdivide::Branching)1>::recover
          (divider<unsigned_short,_(libdivide::Branching)1> *this)

{
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (this->div).denom.magic;
  bVar2 = (this->div).denom.more & 0x1f;
  if (uVar1 != 0) {
    uVar4 = uVar1 | 0x10000;
    uVar3 = 1 << ((byte)(bVar2 + 0x10) & 0x1f);
    return (uVar4 <= (uVar3 % uVar4) * 2) + 1 + (short)(uVar3 / uVar4) * 2;
  }
  return (unsigned_short)(1 << ((byte)(bVar2 + 1) & 0x1f));
}

Assistant:

T recover() const { return div.recover(); }